

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeShallowSwapExtension
          (ExtensionSet *this,ExtensionSet *other,int number)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  TrivialAtomicInt TVar7;
  string *psVar8;
  Arena **v1;
  Arena **v2;
  LogMessage *pLVar9;
  Extension *pEVar10;
  Extension *pEVar11;
  undefined1 auVar12 [16];
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar13;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  string *local_38;
  string *absl_log_internal_check_op_result;
  Extension *other_ext;
  Extension *this_ext;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *other_local;
  ExtensionSet *this_local;
  
  if (this != other) {
    this_ext._4_4_ = number;
    pEStack_18 = other;
    other_local = this;
    other_ext = FindOrNull(this,number);
    absl_log_internal_check_op_result = (string *)FindOrNull(pEStack_18,this_ext._4_4_);
    if ((string *)other_ext != absl_log_internal_check_op_result) {
      v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                     (&this->arena_);
      v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Arena*>
                     (&pEStack_18->arena_);
      local_38 = absl::lts_20240722::log_internal::
                 Check_EQImpl<google::protobuf::Arena*,google::protobuf::Arena*>
                           (v1,v2,"arena_ == other->arena_");
      pEVar10 = other_ext;
      psVar8 = absl_log_internal_check_op_result;
      if (local_38 != (string *)0x0) {
        auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_38);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                   ,0x4be,auVar12._0_8_,auVar12._8_8_);
        pLVar9 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_50);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar9);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
      }
      if ((other_ext == (Extension *)0x0) || (absl_log_internal_check_op_result == (string *)0x0)) {
        if (other_ext == (Extension *)0x0) {
          pVar13 = Insert(this,this_ext._4_4_);
          pEVar10 = pVar13.first;
          pEVar10->field_0 = *(anon_union_8_9_fdc4a54a_for_Extension_0 *)psVar8;
          uVar1 = *(undefined1 *)((long)&psVar8->_M_string_length + 1);
          uVar2 = *(undefined1 *)((long)&psVar8->_M_string_length + 2);
          uVar3 = *(undefined1 *)((long)&psVar8->_M_string_length + 3);
          uVar4 = *(undefined4 *)((long)&psVar8->_M_string_length + 4);
          pEVar10->type = *(undefined1 *)&psVar8->_M_string_length;
          pEVar10->is_repeated = (bool)uVar1;
          pEVar10->field_0xa = uVar2;
          pEVar10->is_packed = (bool)uVar3;
          pEVar10->cached_size = (TrivialAtomicInt)uVar4;
          pEVar10->descriptor = (FieldDescriptor *)(psVar8->field_2)._M_allocated_capacity;
          Erase(pEStack_18,this_ext._4_4_);
        }
        else {
          pVar13 = Insert(pEStack_18,this_ext._4_4_);
          pEVar11 = pVar13.first;
          pEVar11->field_0 = pEVar10->field_0;
          bVar5 = pEVar10->is_repeated;
          uVar1 = pEVar10->field_0xa;
          bVar6 = pEVar10->is_packed;
          TVar7.int_ = (pEVar10->cached_size).int_[0];
          pEVar11->type = pEVar10->type;
          pEVar11->is_repeated = bVar5;
          pEVar11->field_0xa = uVar1;
          pEVar11->is_packed = bVar6;
          pEVar11->cached_size = (TrivialAtomicInt)TVar7.int_;
          pEVar11->descriptor = pEVar10->descriptor;
          Erase(this,this_ext._4_4_);
        }
      }
      else {
        std::swap<google::protobuf::internal::ExtensionSet::Extension>
                  (other_ext,(Extension *)absl_log_internal_check_op_result);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeShallowSwapExtension(ExtensionSet* other, int number) {
  if (this == other) return;

  Extension* this_ext = FindOrNull(number);
  Extension* other_ext = other->FindOrNull(number);

  if (this_ext == other_ext) return;

  ABSL_DCHECK_EQ(arena_, other->arena_);

  if (this_ext != nullptr && other_ext != nullptr) {
    std::swap(*this_ext, *other_ext);
  } else if (this_ext == nullptr) {
    *Insert(number).first = *other_ext;
    other->Erase(number);
  } else {
    *other->Insert(number).first = *this_ext;
    Erase(number);
  }
}